

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::LeastGreatestFunction<short,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  short sVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  idx_t iVar4;
  reference pvVar5;
  VectorType vector_type_p;
  idx_t iVar6;
  idx_t iVar7;
  idx_t col_idx;
  ulong uVar8;
  pointer pVVar9;
  pointer pVVar10;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  
  pVVar9 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar10 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)pVVar10 - (long)pVVar9 == 0x68) {
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::Reference(result,pvVar5);
    return;
  }
  vector_type_p = CONSTANT_VECTOR;
  for (uVar8 = 0; uVar8 < (ulong)(((long)pVVar10 - (long)pVVar9) / 0x68); uVar8 = uVar8 + 1) {
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar8);
    if (pvVar5->vector_type != CONSTANT_VECTOR) {
      vector_type_p = FLAT_VECTOR;
    }
    pVVar9 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar10 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pdVar2 = result->data;
  uVar8 = 0;
  switchD_004a0b15::default(result_has_value,0,0x800);
  do {
    if ((ulong)(((long)pVVar10 - (long)pVVar9) / 0x68) <= uVar8) {
      StandardLeastGreatest<false>::FinalizeResult(args->count,result_has_value,result,state);
      Vector::SetVectorType(result,vector_type_p);
      return;
    }
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar8);
    if (pvVar5->vector_type == CONSTANT_VECTOR) {
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar8);
      puVar3 = (pvVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) goto LAB_00cd6097;
    }
    else {
LAB_00cd6097:
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar8);
      Vector::ToUnifiedFormat(pvVar5,args->count,&vdata);
      iVar4 = args->count;
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar6 = 0; iVar4 != iVar6; iVar6 = iVar6 + 1) {
          iVar7 = iVar6;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar7 = (idx_t)(vdata.sel)->sel_vector[iVar6];
          }
          sVar1 = *(short *)(vdata.data + iVar7 * 2);
          if ((result_has_value[iVar6] != true) || (sVar1 < *(short *)(pdVar2 + iVar6 * 2))) {
            result_has_value[iVar6] = true;
            *(short *)(pdVar2 + iVar6 * 2) = sVar1;
          }
        }
      }
      else {
        for (iVar6 = 0; iVar4 != iVar6; iVar6 = iVar6 + 1) {
          iVar7 = iVar6;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar7 = (idx_t)(vdata.sel)->sel_vector[iVar6];
          }
          if (((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
                >> (iVar7 & 0x3f) & 1) != 0) &&
             ((sVar1 = *(short *)(vdata.data + iVar7 * 2), result_has_value[iVar6] != true ||
              (sVar1 < *(short *)(pdVar2 + iVar6 * 2))))) {
            result_has_value[iVar6] = true;
            *(short *)(pdVar2 + iVar6 * 2) = sVar1;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar8 = uVar8 + 1;
    pVVar9 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar10 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}